

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

_Bool player_book_has_unlearned_spells(player *p)

{
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object **item_list;
  class_book *pcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t item_max;
  
  item_max = (ulong)z_info->floor_size + (ulong)z_info->pack_size;
  item_list = (object **)mem_zalloc((ulong)(uint)((int)item_max * 8));
  if ((p->upkeep->new_spells != L'\0') &&
     (wVar3 = scan_items(item_list,item_max,p,L'\x06',obj_can_study), L'\0' < wVar3)) {
    uVar6 = 0;
    do {
      pcVar4 = player_object_to_book(p,item_list[uVar6]);
      if (pcVar4 == (class_book *)0x0) {
        bVar1 = false;
      }
      else {
        bVar1 = false;
        if (L'\0' < pcVar4->num_spells) {
          lVar5 = 0x20;
          lVar7 = 0;
          do {
            _Var2 = spell_okay_to_study(p,*(wchar_t *)((long)&pcVar4->spells->name + lVar5));
            if (_Var2) {
              mem_free(item_list);
              bVar1 = true;
              break;
            }
            lVar7 = lVar7 + 1;
            lVar5 = lVar5 + 0x38;
          } while (lVar7 < pcVar4->num_spells);
        }
      }
      if (bVar1) {
        return true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)wVar3);
  }
  mem_free(item_list);
  return false;
}

Assistant:

bool player_book_has_unlearned_spells(struct player *p)
{
	int i, j;
	int item_max = z_info->pack_size + z_info->floor_size;
	struct object **item_list = mem_zalloc(item_max * sizeof(struct object *));
	int item_num;

	/* Check if the player can learn new spells */
	if (!p->upkeep->new_spells) {
		mem_free(item_list);
		return false;
	}

	/* Check through all available books */
	item_num = scan_items(item_list, item_max, p, USE_INVEN | USE_FLOOR,
		obj_can_study);
	for (i = 0; i < item_num; i++) {
		const struct class_book *book = player_object_to_book(p, item_list[i]);
		if (!book) continue;

		/* Extract spells */
		for (j = 0; j < book->num_spells; j++)
			if (spell_okay_to_study(p, book->spells[j].sidx)) {
				/* There is a spell the player can study */
				mem_free(item_list);
				return true;
			}
	}

	mem_free(item_list);
	return false;
}